

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O2

int raw_decode(opj_raw_t *raw)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = raw->ct;
  if (uVar2 == 0) {
    raw->ct = 8;
    uVar1 = raw->len;
    if (uVar1 == raw->lenmax) {
      raw->c = 0xff;
      uVar2 = 8;
      bVar3 = 0xff;
    }
    else {
      if (raw->c == 0xff) {
        raw->ct = 7;
        uVar2 = 7;
      }
      else {
        uVar2 = 8;
      }
      bVar3 = raw->start[uVar1];
      raw->c = bVar3;
      raw->len = uVar1 + 1;
    }
  }
  else {
    bVar3 = raw->c;
  }
  raw->ct = uVar2 - 1;
  return (int)((bVar3 >> (uVar2 - 1 & 0x1f) & 1) != 0);
}

Assistant:

int raw_decode(opj_raw_t *raw) {
	int d;
	if (raw->ct == 0) {
		raw->ct = 8;
		if (raw->len == raw->lenmax) {
			raw->c = 0xff;
		} else {
			if (raw->c == 0xff) {
				raw->ct = 7;
			}
			raw->c = *(raw->start + raw->len);
			raw->len++;
		}
	}
	raw->ct--;
	d = (raw->c >> raw->ct) & 0x01;
	
	return d;
}